

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *metavar,char *help,
          Callback *callback)

{
  undefined1 *puVar1;
  undefined1 local_128 [8];
  Option option;
  undefined1 local_88 [16];
  string local_78;
  string local_58;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  std::__cxx11::string::string((string *)&option.callback._M_invoker,long_name,&local_33);
  std::__cxx11::string::string((string *)&local_78,metavar,&local_32);
  std::__cxx11::string::string((string *)&local_58,help,&local_31);
  Option::Option((Option *)local_128,short_name,(string *)&option.callback._M_invoker,&local_78,Yes,
                 &local_58,callback);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (option.callback._M_invoker != (_Invoker_type)local_88) {
    operator_delete(option.callback._M_invoker);
  }
  std::vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>>::
  emplace_back<wabt::OptionParser::Option_const&>
            ((vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>> *)
             &this->options_,(Option *)local_128);
  if (option.callback.super__Function_base._M_functor._8_8_ != 0) {
    puVar1 = (undefined1 *)((long)&option.help.field_2 + 8);
    (*(code *)option.callback.super__Function_base._M_functor._8_8_)(puVar1,puVar1,3);
  }
  if ((size_type *)option._72_8_ != &option.help._M_string_length) {
    operator_delete((void *)option._72_8_);
  }
  if ((size_type *)option.long_name.field_2._8_8_ != &option.metavar._M_string_length) {
    operator_delete((void *)option.long_name.field_2._8_8_);
  }
  if ((size_type *)option._0_8_ != &option.long_name._M_string_length) {
    operator_delete((void *)option._0_8_);
  }
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* metavar,
                             const char* help,
                             const Callback& callback) {
  Option option(short_name, long_name, metavar, HasArgument::Yes, help,
                callback);
  AddOption(option);
}